

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

void __thiscall MockSupport::clear(MockSupport *this)

{
  MockSupport *pMVar1;
  MockSupport *support;
  MockNamedValueListNode *p;
  MockSupport *this_local;
  
  if (this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
    (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[1])();
  }
  this->lastActualFunctionCall_ = (MockCheckedActualCall *)0x0;
  this->tracing_ = false;
  MockActualCallTrace::clearInstance();
  MockExpectedCallsList::deleteAllExpectationsAndClearList(&this->expectations_);
  this->ignoreOtherCalls_ = false;
  this->enabled_ = true;
  this->actualCallOrder_ = 0;
  this->expectedCallOrder_ = 0;
  this->strictOrdering_ = false;
  for (support = (MockSupport *)MockNamedValueList::begin(&this->data_);
      support != (MockSupport *)0x0;
      support = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)support)) {
    pMVar1 = getMockSupport(this,(MockNamedValueListNode *)support);
    if ((pMVar1 != (MockSupport *)0x0) &&
       ((*pMVar1->_vptr_MockSupport[0x27])(), pMVar1 != (MockSupport *)0x0)) {
      (*pMVar1->_vptr_MockSupport[1])();
    }
  }
  MockNamedValueList::clear(&this->data_);
  return;
}

Assistant:

void MockSupport::clear()
{
    delete lastActualFunctionCall_;
    lastActualFunctionCall_ = NULLPTR;

    tracing_ = false;
    MockActualCallTrace::clearInstance();

    expectations_.deleteAllExpectationsAndClearList();
    ignoreOtherCalls_ = false;
    enabled_ = true;
    actualCallOrder_ = 0;
    expectedCallOrder_ = 0;
    strictOrdering_ = false;

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next()) {
        MockSupport* support = getMockSupport(p);
        if (support) {
            support->clear();
            delete support;
        }
    }
    data_.clear();
}